

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O1

phits_file_t phits_open_internal(char *filename)

{
  int iVar1;
  phits_fileinternal_t *f;
  FILE *pFVar2;
  char *pcVar3;
  int iVar4;
  
  f = (phits_fileinternal_t *)calloc(1,0x110);
  if (f == (phits_fileinternal_t *)0x0) {
    pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
    if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    pcVar3 = "memory allocation failure";
LAB_00102884:
    fprintf(pFVar2,"ERROR: %s\n",pcVar3);
    exit(1);
  }
  f->lbuf = 0;
  f->haspolarisation = 0;
  f->reclen = 4;
  f->particlesize = 0;
  (f->part).x = 0.0;
  (f->part).y = 0.0;
  (f->part).z = 0.0;
  (f->part).dirx = 0.0;
  (f->part).diry = 0.0;
  (f->part).dirz = 0.0;
  (f->part).polx = 0.0;
  (f->part).poly = 0.0;
  (f->part).polz = 0.0;
  (f->part).weight = 0.0;
  (f->part).ekin = 0.0;
  (f->part).time = 0.0;
  (f->part).rawtype = 0;
  (f->part).pdgcode = 0;
  mcpl_generic_fopen(f,filename);
  iVar4 = 1 - f->lbuf;
  if (0 < iVar4) {
    iVar1 = mcpl_generic_fread_try(f,f->buf + f->lbuf,iVar4);
    if (iVar1 != iVar4) {
      f->particlesize = 0;
      iVar4 = 0;
      goto LAB_001027f2;
    }
    f->lbuf = 1;
  }
  iVar4 = phits_tryload_reclen(f,4);
  if (iVar4 == 0) {
    iVar4 = phits_tryload_reclen(f,8);
    if (iVar4 == 0) {
      pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
      if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      if (f->lbuf < 8) {
        pcVar3 = "Invalid PHITS dump file: too short\n";
      }
      else {
        pcVar3 = "Invalid PHITS dump file: Problems reading first record.\n";
      }
      goto LAB_00102884;
    }
  }
  if (f->reclen == 8) {
    pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
    if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fwrite("phits_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
           ,0x8d,1,pFVar2);
  }
  iVar4 = 0;
  if (f->particlesize != 0x50) {
    if (f->particlesize != 0x68) {
      pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
      if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      pcVar3 = 
      "Invalid PHITS dump file: Does not contain exactly 10 or 13 fields in each particle - like due to unsupported configuration flags being used when producing the file.\n"
      ;
      goto LAB_00102884;
    }
    iVar4 = 1;
  }
LAB_001027f2:
  f->haspolarisation = iVar4;
  return (phits_file_t)f;
}

Assistant:

phits_file_t phits_open_internal( const char * filename )
{
  phits_fileinternal_t * f = (phits_fileinternal_t*)calloc(1,sizeof(phits_fileinternal_t));
  if (!f)
    phits_error("memory allocation failure");

  phits_file_t out;
  out.internal = f;

  //Init:
  f->particlesize = 0;
  f->lbuf = 0;
  f->reclen = 4;
  f->haspolarisation = 0;
  memset( &( f->part ),0,sizeof(f->part) );

  //open file (supports gzipped if ends with .gz):
  f->filehandle = mcpl_generic_fopen( filename );

  //Try to read first Fortran record marker, keeping in mind that we do not
  //know if it is 32bit or 64bit, and that an empty file is to be interpreted
  //as a valid PHITS dump file with 0 particles:

  if (!phits_ensure_load(f,1)) {
    //Can't read a single byte. Assume that this indicates an empty file and
    //therefore a valid PHITS dump file with 0 particles:
    //file with 0 particles, mark as EOF:
    f->particlesize = 0;
    f->haspolarisation = 0;//Convention: We mark empty files as NOT HAVING
    //polarisation info (to avoid potentially inflating
    //mcpl files in various merge/conversion
    //scenarios).
    return out;
  }

  //Try to read first record with first 32bit then 64bit record lengths
  //(updating f->reclen and f->particlesize in case of success):
  if (!phits_tryload_reclen(f,4)) {
    if (!phits_tryload_reclen(f,8)) {
      if (f->lbuf<8)
        phits_error("Invalid PHITS dump file: too short\n");
      phits_error("Invalid PHITS dump file: Problems reading first record.\n");
    }
  }
  assert( f->reclen==4 || f->reclen==8 );

  if (f->reclen==8) {
    fprintf(phits_stdout(),"phits_open_file WARNING: 64bit Fortran records"
            " detected which is untested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
  }

  if (f->particlesize == 10*sizeof(double)) {
    f->haspolarisation = 0;
  } else if (f->particlesize == 13*sizeof(double)) {
    f->haspolarisation = 1;
  } else {
    phits_error("Invalid PHITS dump file: Does not contain exactly 10 or 13 fields in each"
                " particle - like due to unsupported configuration flags being used when"
                " producing the file.\n");
  }

  return out;
}